

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O2

Instr * __thiscall Peeps::PeepRedundant(Peeps *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  undefined4 *puVar4;
  IntConstOpnd *pIVar5;
  RegOpnd *pRVar6;
  Instr *pIVar7;
  JITTimeFunctionBody *this_00;
  Instr *this_01;
  Opnd *this_02;
  
  OVar3 = instr->m_opcode;
  if (((OVar3 == ADD) || (OVar3 == SUB)) || (OVar3 == OR)) {
    if ((instr->m_src1 == (Opnd *)0x0) || (this_02 = instr->m_src2, this_02 == (Opnd *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,1099,"(instr->GetSrc1() && instr->GetSrc2())",
                         "instr->GetSrc1() && instr->GetSrc2()");
      if (!bVar2) goto LAB_005add24;
      *puVar4 = 0;
      this_02 = instr->m_src2;
    }
    bVar2 = IR::Opnd::IsIntConstOpnd(this_02);
    if ((bVar2) &&
       (pIVar5 = IR::Opnd::AsIntConstOpnd(instr->m_src2),
       (pIVar5->super_EncodableOpnd<long>).m_value == 0)) {
LAB_005add09:
      pIVar7 = instr->m_next;
      IR::Instr::Remove(instr);
      return pIVar7;
    }
    OVar3 = instr->m_opcode;
  }
  if ((((OVar3 == NOP) && (instr->m_dst != (Opnd *)0x0)) &&
      (bVar2 = IR::Opnd::IsRegOpnd(instr->m_dst), bVar2)) &&
     (pRVar6 = IR::Opnd::AsRegOpnd(instr->m_dst), pIVar7 = instr, pRVar6->m_reg == RegArg2)) {
    do {
      pIVar7 = IR::Instr::GetPrevRealInstrOrLabel(pIVar7);
      if (pIVar7->m_opcode == CALL) {
        this_00 = Func::GetJITFunctionBody(this->func);
        bVar2 = JITTimeFunctionBody::IsWasmFunction(this_00);
        if (bVar2) goto LAB_005add09;
      }
      else if (pIVar7->m_opcode == IMUL) goto LAB_005add09;
    } while ((6 < pIVar7->m_kind) || (this_01 = instr, (0x68U >> (pIVar7->m_kind & 0x1f) & 1) == 0))
    ;
    do {
      this_01 = IR::Instr::GetNextRealInstrOrLabel(this_01);
      if (this_01->m_opcode == DIV) goto LAB_005add09;
      bVar2 = IR::Instr::EndsBasicBlock(this_01);
    } while (!bVar2);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x481,"(found)","edx = NOP without an IMUL or DIV");
    if (!bVar2) {
LAB_005add24:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return instr;
}

Assistant:

IR::Instr *
Peeps::PeepRedundant(IR::Instr *instr)
{
    IR::Instr *retInstr = instr;

    if (instr->m_opcode == Js::OpCode::ADD || instr->m_opcode == Js::OpCode::SUB || instr->m_opcode == Js::OpCode::OR)
    {
        Assert(instr->GetSrc1() && instr->GetSrc2());
        if( (instr->GetSrc2()->IsIntConstOpnd() && instr->GetSrc2()->AsIntConstOpnd()->GetValue() == 0))
        {
            // remove instruction
            retInstr = instr->m_next;
            instr->Remove();
            return retInstr;
        }
    }
#if _M_IX86
    RegNum edx = RegEDX;
#else
    RegNum edx = RegRDX;
#endif
    if (instr->m_opcode == Js::OpCode::NOP && instr->GetDst() != NULL
        && instr->GetDst()->IsRegOpnd() && instr->GetDst()->AsRegOpnd()->GetReg() == edx)
    {
        // dummy def used for non-32bit ovf check for IMUL
        // check edx is not killed between IMUL and edx = NOP, then remove the NOP
        bool found = false;
        IR::Instr *nopInstr = instr;
        do
        {
            instr = instr->GetPrevRealInstrOrLabel();
            if (
                instr->m_opcode == Js::OpCode::IMUL ||
                (instr->m_opcode == Js::OpCode::CALL && this->func->GetJITFunctionBody()->IsWasmFunction())
            )
            {
                found = true;
                break;
            }
        } while(!instr->StartsBasicBlock());

        if (found)
        {
            retInstr = nopInstr->m_next;
            nopInstr->Remove();
        }
        else
        {
            instr = nopInstr;
            do
            {
                instr = instr->GetNextRealInstrOrLabel();
                if (instr->m_opcode == Js::OpCode::DIV)
                {
                    found = true;
                    retInstr = nopInstr->m_next;
                    nopInstr->Remove();
                    break;
                }
            } while (!instr->EndsBasicBlock());

            AssertMsg(found, "edx = NOP without an IMUL or DIV");
        }
    }
    return retInstr;
}